

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::IsDeformable(ON_PolyCurve *this)

{
  uint uVar1;
  ON_Curve *pOVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar5];
    if (pOVar2 != (ON_Curve *)0x0) {
      iVar3 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1d])();
      if ((char)iVar3 == '\0') break;
    }
  }
  return (long)(int)uVar1 <= (long)uVar5;
}

Assistant:

bool ON_PolyCurve::IsDeformable() const
{
  bool rc = true;
  const int count = Count();
  int segment_index;
  for ( segment_index = 0; segment_index < count ; segment_index++ )
  {
    const ON_Curve* seg = m_segment[segment_index];
    if ( seg && !seg->IsDeformable() )
    {
      rc = false;
      break;
    }
  }
  return rc;
}